

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

void * array_random_new(t_symbol *s,int argc,t_atom *argv)

{
  t_object *owner;
  t_array_random *x;
  t_atom *argv_local;
  t_symbol *ptStack_10;
  int argc_local;
  t_symbol *s_local;
  
  x = (t_array_random *)argv;
  argv_local._4_4_ = argc;
  ptStack_10 = s;
  owner = (t_object *)
          array_rangeop_new(array_random_class,s,(int *)((long)&argv_local + 4),(t_atom **)&x,0,1,1)
  ;
  array_random_new::random_nextseed = array_random_new::random_nextseed * 0x19fb4787 + 0x37ed14ff;
  *(uint *)&owner[2].te_inlet = array_random_new::random_nextseed;
  outlet_new(owner,&s_float);
  return owner;
}

Assistant:

static void *array_random_new(t_symbol *s, int argc, t_atom *argv)
{
    t_array_random *x = array_rangeop_new(array_random_class, s,
        &argc, &argv, 0, 1, 1);
    static unsigned int random_nextseed = 584926371;
    random_nextseed = random_nextseed * 435898247 + 938284287;
    x->x_state = random_nextseed;
    outlet_new(&x->x_r.x_tc.tc_obj, &s_float);
    return (x);
}